

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O2

char * __thiscall E64::blitter_ic::terminal_enter_command(blitter_ic *this,uint8_t no)

{
  bool *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool *pbVar6;
  undefined7 in_register_00000031;
  blit_t *pbVar7;
  ulong uVar8;
  
  pbVar7 = this->blit;
  uVar5 = CONCAT71(in_register_00000031,no) & 0xffffffff;
  uVar3 = *(uint *)&pbVar7[uVar5].cursor_position;
  bVar2 = pbVar7[uVar5].columns;
  uVar4 = (uint)bVar2;
  for (uVar8 = 0; uVar8 < bVar2; uVar8 = uVar8 + 1) {
    pbVar7[uVar5].command_buffer[uVar8] =
         this->tile_ram
         [((uVar3 - (uVar3 & 0xffff) % uVar4) + (int)uVar8 & 0xffff) +
          (int)CONCAT71(in_register_00000031,no) * 0x2000 & 0x1fffff];
    pbVar7 = this->blit;
    bVar2 = pbVar7[uVar5].columns;
  }
  pbVar6 = (bool *)(pbVar7[uVar5].command_buffer + (ulong)bVar2 + 1);
  do {
    pbVar1 = pbVar6 + -2;
    pbVar6 = pbVar6 + -1;
  } while (*pbVar1 == true);
  *pbVar6 = false;
  return this->blit[uVar5].command_buffer;
}

Assistant:

char *E64::blitter_ic::terminal_enter_command(uint8_t no)
{
	uint16_t start_of_line = blit[no].cursor_position - (blit[no].cursor_position % blit[no].get_columns());
	for (size_t i = 0; i < blit[no].get_columns(); i++) {
		blit[no].command_buffer[i] = terminal_get_tile(no, start_of_line + i);
	}
	size_t i = blit[no].get_columns() - 1;
	while (blit[no].command_buffer[i] == ' ') i--;
	blit[no].command_buffer[i + 1] = 0;

	return blit[no].command_buffer;
}